

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckms_quantiles.cc
# Opt level: O1

bool __thiscall prometheus::detail::CKMSQuantiles::insertBatch(CKMSQuantiles *this)

{
  array<double,_500UL> *__args;
  pointer pIVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double *pdVar11;
  size_t i;
  bool bVar12;
  double dVar13;
  double v;
  int local_48 [2];
  double local_40;
  size_t local_38;
  
  local_38 = this->buffer_count_;
  if (local_38 != 0) {
    __args = &this->buffer_;
    pdVar11 = (this->buffer_)._M_elems + local_38;
    uVar5 = (long)(local_38 * 8) >> 3;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (__args,pdVar11,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<double*,__gnu_cxx::__ops::_Iter_less_iter>(__args,pdVar11);
    bVar12 = (this->sample_).
             super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (this->sample_).
             super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar12) {
      local_40 = (double)CONCAT44(local_40._4_4_,1);
      local_48[0] = 0;
      std::
      vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
      ::emplace_back<double&,int,int>
                ((vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
                  *)&this->sample_,__args->_M_elems,(int *)&local_40,local_48);
      this->count_ = this->count_ + 1;
    }
    uVar5 = (ulong)bVar12;
    if (uVar5 < this->buffer_count_) {
      uVar6 = 1;
      uVar10 = 0;
      do {
        local_40 = (this->buffer_)._M_elems[uVar5];
        pIVar1 = (this->sample_).
                 super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)(this->sample_).
                      super__Vector_base<prometheus::detail::CKMSQuantiles::Item,_std::allocator<prometheus::detail::CKMSQuantiles::Item>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4;
        if (uVar6 < uVar8) {
          uVar3 = uVar6;
          uVar9 = uVar10;
          do {
            uVar7 = uVar3;
            uVar6 = uVar7;
            uVar10 = uVar9;
            if (local_40 < pIVar1[uVar9].value || local_40 == pIVar1[uVar9].value) break;
            uVar6 = uVar8;
            uVar3 = uVar7 + 1;
            uVar10 = uVar8 - 1;
            uVar9 = uVar7;
          } while (uVar8 != uVar7 + 1);
        }
        uVar10 = uVar6 - (local_40 < pIVar1[uVar10].value);
        iVar4 = 0;
        if ((uVar10 != 1) && (iVar4 = 0, uVar10 + 1 != uVar8)) {
          dVar13 = allowableError(this,(int)(uVar10 + 1));
          dVar13 = floor(dVar13);
          iVar4 = (int)dVar13 + 1;
        }
        local_48[1] = 1;
        local_48[0] = iVar4;
        std::
        vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
        ::_M_emplace_aux<double&,int,int&>
                  ((vector<prometheus::detail::CKMSQuantiles::Item,std::allocator<prometheus::detail::CKMSQuantiles::Item>>
                    *)&this->sample_,pIVar1 + uVar10,&local_40,local_48 + 1,local_48);
        this->count_ = this->count_ + 1;
        uVar6 = uVar10 + 1;
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->buffer_count_);
    }
    this->buffer_count_ = 0;
  }
  return local_38 != 0;
}

Assistant:

bool CKMSQuantiles::insertBatch() {
  if (buffer_count_ == 0) {
    return false;
  }

  std::sort(buffer_.begin(), buffer_.begin() + buffer_count_);

  std::size_t start = 0;
  if (sample_.empty()) {
    sample_.emplace_back(buffer_[0], 1, 0);
    ++start;
    ++count_;
  }

  std::size_t idx = 0;
  std::size_t item = idx++;

  for (std::size_t i = start; i < buffer_count_; ++i) {
    double v = buffer_[i];
    while (idx < sample_.size() && sample_[item].value < v) {
      item = idx++;
    }

    if (sample_[item].value > v) {
      --idx;
    }

    int delta;
    if (idx - 1 == 0 || idx + 1 == sample_.size()) {
      delta = 0;
    } else {
      delta = static_cast<int>(std::floor(allowableError(idx + 1))) + 1;
    }

    sample_.emplace(sample_.begin() + idx, v, 1, delta);
    count_++;
    item = idx++;
  }

  buffer_count_ = 0;
  return true;
}